

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  unsigned_short uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  float *pfVar4;
  uint i;
  float fVar5;
  
  uVar2 = (this->IndexLookup).Size;
  if ((int)uVar2 < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0xab0,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  i = (uint)dst;
  if (dst < uVar2) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if (uVar2 <= src) {
      puVar3 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i);
      *puVar3 = 0xffff;
      fVar5 = 1.0;
      goto LAB_00153f8f;
    }
  }
  else {
    if (uVar2 <= src) {
      return;
    }
    GrowIndex(this,dst + 1);
  }
  uVar1 = (this->IndexLookup).Data[src];
  puVar3 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i);
  *puVar3 = uVar1;
  fVar5 = (this->IndexAdvanceX).Data[src];
LAB_00153f8f:
  pfVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,i);
  *pfVar4 = fVar5;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}